

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase495::run(TestCase495 *this)

{
  Fault FVar1;
  long *plVar2;
  PromiseNode *pPVar3;
  int iVar4;
  undefined8 *puVar5;
  int originalDirFd;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:508:3)>
  _kjDefer508;
  Own<kj::NetworkAddress> addr;
  Own<kj::ConnectionReceiver> listener;
  AsyncIoContext ioContext;
  undefined8 *local_a8;
  long *plStack_a0;
  undefined1 local_94 [12];
  long *local_88;
  Fault local_80;
  undefined1 local_78;
  Promise<kj::Own<kj::NetworkAddress>_> local_70;
  undefined8 *local_60;
  long *local_58;
  undefined8 *local_50;
  long *local_48;
  undefined8 *local_40;
  long *local_38;
  Promise<kj::Own<kj::AsyncIoStream>_> local_20;
  
  setupAsyncIo();
  puVar5 = (undefined8 *)(**(code **)(*local_38 + 0x18))();
  (**(code **)*puVar5)(&local_a8,puVar5,"unix-abstract:foo",0x12,0);
  Promise<kj::Own<kj::NetworkAddress>_>::wait(&local_70,&local_a8);
  plVar2 = plStack_a0;
  if (plStack_a0 != (long *)0x0) {
    plStack_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  (*(local_70.super_PromiseBase.node.ptr)->_vptr_PromiseNode[1])(&local_60);
  do {
    local_94._0_4_ = open(".",0x90000);
    if (-1 < (int)local_94._0_4_) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_80.exception = (Exception *)0x0;
    local_a8 = (undefined8 *)0x0;
    plStack_a0 = (long *)0x0;
    _::Debug::Fault::init
              (&local_80,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    _::Debug::Fault::fatal(&local_80);
  }
  do {
    iVar4 = chdir("/");
    if (-1 < iVar4) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_80.exception = (Exception *)0x0;
    local_a8 = (undefined8 *)0x0;
    plStack_a0 = (long *)0x0;
    _::Debug::Fault::init
              (&local_80,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    _::Debug::Fault::fatal(&local_80);
  }
  local_80.exception = (Exception *)local_94;
  local_78 = 0;
  (**(local_70.super_PromiseBase.node.ptr)->_vptr_PromiseNode)(local_94 + 4);
  Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::ConnectionReceiver>>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_a8,
             (Own<kj::ConnectionReceiver> *)(local_94 + 4));
  Promise<kj::Own<kj::AsyncIoStream>_>::wait(&local_20,&local_a8);
  pPVar3 = local_20.super_PromiseBase.node.ptr;
  if (local_20.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_20.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_20.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_20.super_PromiseBase.node.disposer,
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  plVar2 = plStack_a0;
  if (plStack_a0 != (long *)0x0) {
    plStack_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_88;
  FVar1.exception = local_80.exception;
  if (local_88 != (long *)0x0) {
    local_88 = (long *)0x0;
    (*(code *)**(undefined8 **)local_94._4_8_)
              (local_94._4_8_,*(long *)(*plVar2 + -0x10) + (long)plVar2);
    FVar1.exception = local_80.exception;
  }
  do {
    iVar4 = fchdir(*(int *)&((FVar1.exception)->ownFile).content.ptr);
    if (-1 < iVar4) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_94._4_8_ = 0;
    local_a8 = (undefined8 *)0x0;
    plStack_a0 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)(local_94 + 4),
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)(local_94 + 4));
  }
  close(local_94._0_4_);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    local_58 = (long *)0x0;
    (**(code **)*local_60)(local_60,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pPVar3 = local_70.super_PromiseBase.node.ptr;
  if (local_70.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_70.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_70.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_70.super_PromiseBase.node.disposer,
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  plVar2 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_48;
  if (local_48 != (long *)0x0) {
    local_48 = (long *)0x0;
    (**(code **)*local_50)(local_50,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<NetworkAddress> addr = network.parseAddress("unix-abstract:foo").wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  int originalDirFd;
  KJ_SYSCALL(originalDirFd = open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_DEFER(close(originalDirFd));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}